

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genFile
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema file)

{
  bool bVar1;
  Which WVar2;
  uint64_t i;
  StringTree *in_stack_fffffffffffffe50;
  Indent local_174;
  Schema local_170;
  StringTree local_168;
  anon_class_16_2_3fdfdf37 local_130;
  Reader local_120;
  Mapper<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader> local_f0;
  Array<kj::StringTree> local_c0;
  CappedArray<char,_17UL> local_a8;
  ArrayPtr<const_char> local_88 [2];
  uint local_64;
  Fault local_60;
  Fault f;
  undefined1 local_50 [7];
  DebugExpression<bool> _kjCondition;
  Reader proto;
  CapnpcCapnpMain *this_local;
  Schema file_local;
  
  this_local = (CapnpcCapnpMain *)file.raw;
  file_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  Schema::getProto((Reader *)local_50,(Schema *)&this_local);
  f.exception._6_1_ = capnp::schema::Node::Reader::isFile((Reader *)local_50);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    WVar2 = capnp::schema::Node::Reader::which((Reader *)local_50);
    local_64 = (uint)WVar2;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22],unsigned_int>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
               ,0x28a,FAILED,"proto.isFile()",
               "_kjCondition,\"Expected a file node.\", (uint)proto.which()",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [22])"Expected a file node.",&local_64);
    kj::_::Debug::Fault::fatal(&local_60);
  }
  local_88[0] = (ArrayPtr<const_char>)
                capnp::schema::Node::Reader::getDisplayName((Reader *)local_50);
  i = capnp::schema::Node::Reader::getId((Reader *)local_50);
  kj::hex(&local_a8,i);
  capnp::schema::Node::Reader::getAnnotations(&local_120,(Reader *)local_50);
  kj::_::Mapper<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader>::Mapper
            (&local_f0,&local_120);
  local_130.file = (Schema *)&this_local;
  local_130.this = this;
  kj::_::Mapper<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:655:7)>
            (&local_c0,&local_f0,&local_130);
  local_170.raw = (RawBrandedSchema *)this_local;
  Indent::Indent(&local_174,0);
  genNestedDecls(&local_168,this,local_170,local_174);
  kj::
  strTree<char_const(&)[3],capnp::Text::Reader,char_const(&)[2],char_const(&)[4],kj::CappedArray<char,17ul>,char_const(&)[3],kj::Array<kj::StringTree>,kj::StringTree>
            (__return_storage_ptr__,(kj *)0x227193,(char (*) [3])local_88,(Reader *)0x23b62d,
             (char (*) [2])0x2270c5,(char (*) [4])&local_a8,(CappedArray<char,_17UL> *)";\n",
             (char (*) [3])&local_c0,(Array<kj::StringTree> *)&local_168,in_stack_fffffffffffffe50);
  kj::StringTree::~StringTree(&local_168);
  kj::Array<kj::StringTree>::~Array(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genFile(Schema file) {
    auto proto = file.getProto();
    KJ_REQUIRE(proto.isFile(), "Expected a file node.", (uint)proto.which());

    return kj::strTree(
      "# ", proto.getDisplayName(), "\n",
      "@0x", kj::hex(proto.getId()), ";\n",
      KJ_MAP(ann, proto.getAnnotations()) { return genAnnotation(ann, file, "", ";\n"); },
      genNestedDecls(file, Indent(0)));
  }